

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O0

uint8_t winmd::impl::bits_needed(uint32_t value)

{
  undefined1 local_d;
  undefined4 local_c;
  uint8_t bits;
  uint32_t value_local;
  
  local_c = value - 1;
  local_d = '\x01';
  while (local_c = local_c >> 1, local_c != 0) {
    local_d = local_d + '\x01';
  }
  return local_d;
}

Assistant:

constexpr uint8_t bits_needed(uint32_t value) noexcept
    {
        --value;
        uint8_t bits{ 1 };

        while (value >>= 1)
        {
            ++bits;
        }

        return bits;
    }